

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall
binlog::PrettyPrinter::printTime
          (PrettyPrinter *this,OstreamBuffer *out,BrokenDownTime *bdt,int tzoffset,char *tzname)

{
  char c;
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  OstreamBuffer *this_00;
  
  uVar4 = 0;
  this_00 = (OstreamBuffer *)this;
  while (uVar1 = (this->_timeFormat)._M_string_length, uVar4 < uVar1) {
    pcVar2 = (this->_timeFormat)._M_dataplus._M_p;
    c = pcVar2[uVar4];
    if ((c == '%') && (uVar3 = uVar4 + 1, uVar4 = uVar1, uVar3 != uVar1)) {
      printTimeField((PrettyPrinter *)this_00,out,pcVar2[uVar3],bdt,tzoffset,tzname);
    }
    else {
      uVar3 = uVar4;
      this_00 = out;
      detail::OstreamBuffer::put(out,c);
    }
    uVar4 = uVar3 + 1;
  }
  return;
}

Assistant:

void PrettyPrinter::printTime(detail::OstreamBuffer& out, BrokenDownTime& bdt, int tzoffset, const char* tzname) const
{
  for (std::size_t i = 0; i < _timeFormat.size(); ++i)
  {
    const char c = _timeFormat[i];
    if (c == '%' && ++i != _timeFormat.size())
    {
      const char spec = _timeFormat[i];
      printTimeField(out, spec, bdt, tzoffset, tzname);
    }
    else
    {
      out.put(c);
    }
  }
}